

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

void __thiscall choc::value::Value::Value(Value *this,string_view s)

{
  uint32_t *puVar1;
  undefined8 __ptr;
  Allocator *pAVar2;
  Handle HVar3;
  Type local_48;
  
  local_48.mainType = string;
  local_48.content.object = (Object *)0x0;
  local_48.allocator = (Allocator *)0x0;
  Value(this,&local_48);
  pAVar2 = local_48.allocator;
  __ptr = local_48.content.object;
  if ((char)local_48.mainType < '\0') {
    if (local_48.mainType == object) {
      if (local_48.content.object == (Object *)0x0) goto LAB_001ed91b;
      Type::Object::~Object(local_48.content.object);
    }
    else {
      if ((local_48.mainType != complexArray) || (local_48.content.object == (Object *)0x0))
      goto LAB_001ed91b;
      Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
                ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                 local_48.content.object);
    }
    if (pAVar2 == (Allocator *)0x0) {
      free((void *)__ptr);
    }
    else {
      (**(code **)(*(long *)pAVar2 + 0x20))(pAVar2,__ptr);
    }
  }
LAB_001ed91b:
  puVar1 = (uint32_t *)(this->value).data;
  HVar3 = SimpleStringDictionary::getHandleForString(&this->dictionary,s);
  *puVar1 = HVar3.handle;
  return;
}

Assistant:

inline Value::Value (std::string_view s)  : Value (Type::createString())   { writeUnaligned (value.data, dictionary.getHandleForString (s)); }